

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::FocusTopMostWindowUnderOne(ImGuiWindow *under_this_window,ImGuiWindow *ignore_window)

{
  ImGuiWindow *window_00;
  ImGuiContext *pIVar1;
  ImGuiWindow **ppIVar2;
  ImGuiWindow *in_RSI;
  ImGuiWindow *in_RDI;
  ImGuiWindow *focus_window;
  ImGuiWindow *window;
  int i;
  int offset;
  int start_idx;
  ImGuiContext *g;
  int local_24;
  int local_20;
  int local_1c;
  ImGuiWindow *local_8;
  
  pIVar1 = GImGui;
  local_1c = (GImGui->WindowsFocusOrder).Size + -1;
  if (in_RDI != (ImGuiWindow *)0x0) {
    local_20 = -1;
    local_8 = in_RDI;
    while ((local_8->Flags & 0x1000000U) != 0) {
      local_8 = local_8->ParentWindow;
      local_20 = 0;
    }
    local_1c = FindWindowFocusIndex(local_8);
    local_1c = local_1c + local_20;
  }
  local_24 = local_1c;
  while( true ) {
    if (local_24 < 0) {
      FocusWindow(in_RSI);
      return;
    }
    ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&pIVar1->WindowsFocusOrder,local_24);
    window_00 = *ppIVar2;
    if (((window_00 != in_RSI) && ((window_00->WasActive & 1U) != 0)) &&
       ((window_00->Flags & 0x40200U) != 0x40200)) break;
    local_24 = local_24 + -1;
  }
  NavRestoreLastChildNavWindow(window_00);
  FocusWindow(in_RSI);
  return;
}

Assistant:

void ImGui::FocusTopMostWindowUnderOne(ImGuiWindow* under_this_window, ImGuiWindow* ignore_window)
{
    ImGuiContext& g = *GImGui;
    int start_idx = g.WindowsFocusOrder.Size - 1;
    if (under_this_window != NULL)
    {
        // Aim at root window behind us, if we are in a child window that's our own root (see #4640)
        int offset = -1;
        while (under_this_window->Flags & ImGuiWindowFlags_ChildWindow)
        {
            under_this_window = under_this_window->ParentWindow;
            offset = 0;
        }
        start_idx = FindWindowFocusIndex(under_this_window) + offset;
    }
    for (int i = start_idx; i >= 0; i--)
    {
        // We may later decide to test for different NoXXXInputs based on the active navigation input (mouse vs nav) but that may feel more confusing to the user.
        ImGuiWindow* window = g.WindowsFocusOrder[i];
        IM_ASSERT(window == window->RootWindow);
        if (window != ignore_window && window->WasActive)
            if ((window->Flags & (ImGuiWindowFlags_NoMouseInputs | ImGuiWindowFlags_NoNavInputs)) != (ImGuiWindowFlags_NoMouseInputs | ImGuiWindowFlags_NoNavInputs))
            {
                ImGuiWindow* focus_window = NavRestoreLastChildNavWindow(window);
                FocusWindow(focus_window);
                return;
            }
    }
    FocusWindow(NULL);
}